

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubicLattice.cpp
# Opt level: O1

void __thiscall CubicLattice::createFaces(CubicLattice *this)

{
  int iVar1;
  double dVar2;
  Lattice *this_00;
  int vertexIndex;
  long lVar3;
  long *plVar4;
  cartesian4 cVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<int> __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<int> __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<int> __l_04;
  allocator_type local_116;
  allocator_type local_115;
  int local_114;
  undefined1 **local_110;
  undefined1 **local_108;
  vector<int,_std::allocator<int>_> local_100;
  Lattice *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  long *local_80 [2];
  long local_70 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  int local_48 [4];
  double local_38;
  
  dVar2 = pow((double)(this->super_Lattice).l,3.0);
  if (0.0 < dVar2) {
    local_110 = local_c0;
    local_114 = 0;
    vertexIndex = 0;
    local_108 = local_110;
    local_e8 = &this->super_Lattice;
    do {
      cVar5 = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
      iVar1 = (this->super_Lattice).l + -1;
      if (iVar1 != cVar5.z) {
        if (iVar1 != cVar5.y && iVar1 != cVar5.x) {
          if (cVar5.z < (this->super_Lattice).l + -2) {
            if (cVar5.x != 0) {
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"y","");
              local_c0[0] = local_b0;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"z","");
              local_a0[0] = local_90;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"z","");
              local_80[0] = local_70;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"y","");
              __l._M_len = 4;
              __l._M_array = &local_e0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_60,__l,&local_115);
              local_48[0] = 1;
              local_48[1] = 1;
              local_48[2] = 1;
              local_48[3] = 1;
              __l_00._M_len = 4;
              __l_00._M_array = local_48;
              std::vector<int,_std::allocator<int>_>::vector(&local_100,__l_00,&local_116);
              Lattice::addFace(&this->super_Lattice,vertexIndex,local_114,&local_60,&local_100);
              if (local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_100.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_100.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_60);
              lVar3 = -0x80;
              plVar4 = local_70;
              do {
                if (plVar4 != (long *)plVar4[-2]) {
                  operator_delete((long *)plVar4[-2],*plVar4 + 1);
                }
                plVar4 = plVar4 + -4;
                lVar3 = lVar3 + 0x20;
              } while (lVar3 != 0);
              local_114 = local_114 + 1;
              this = (CubicLattice *)local_e8;
            }
            if (cVar5._0_8_ >> 0x20 != 0) {
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"x","");
              local_c0[0] = local_b0;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"z","");
              local_a0[0] = local_90;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"z","");
              local_80[0] = local_70;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"x","");
              __l_01._M_len = 4;
              __l_01._M_array = &local_e0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_60,__l_01,&local_115);
              local_48[0] = 1;
              local_48[1] = 1;
              local_48[2] = 1;
              local_48[3] = 1;
              __l_02._M_len = 4;
              __l_02._M_array = local_48;
              std::vector<int,_std::allocator<int>_>::vector(&local_100,__l_02,&local_116);
              Lattice::addFace(&this->super_Lattice,vertexIndex,local_114,&local_60,&local_100);
              if (local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_100.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_100.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_60);
              lVar3 = -0x80;
              plVar4 = local_70;
              do {
                if (plVar4 != (long *)plVar4[-2]) {
                  operator_delete((long *)plVar4[-2],*plVar4 + 1);
                }
                plVar4 = plVar4 + -4;
                lVar3 = lVar3 + 0x20;
              } while (lVar3 != 0);
              local_114 = local_114 + 1;
            }
          }
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"x","");
          local_c0[0] = local_b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"y","");
          local_a0[0] = local_90;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"y","");
          local_80[0] = local_70;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"x","");
          __l_03._M_len = 4;
          __l_03._M_array = &local_e0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_60,__l_03,&local_115);
          this_00 = local_e8;
          local_48[0] = 1;
          local_48[1] = 1;
          local_48[2] = 1;
          local_48[3] = 1;
          __l_04._M_len = 4;
          __l_04._M_array = local_48;
          std::vector<int,_std::allocator<int>_>::vector(&local_100,__l_04,&local_116);
          Lattice::addFace(this_00,vertexIndex,local_114,&local_60,&local_100);
          if (local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_60);
          lVar3 = -0x80;
          plVar4 = local_70;
          do {
            if (plVar4 != (long *)plVar4[-2]) {
              operator_delete((long *)plVar4[-2],*plVar4 + 1);
            }
            plVar4 = plVar4 + -4;
            lVar3 = lVar3 + 0x20;
          } while (lVar3 != 0);
          local_114 = local_114 + 1;
          this = (CubicLattice *)local_e8;
        }
      }
      vertexIndex = vertexIndex + 1;
      local_38 = (double)vertexIndex;
      dVar2 = pow((double)(this->super_Lattice).l,3.0);
    } while (local_38 < dVar2);
  }
  return;
}

Assistant:

void CubicLattice::createFaces()
{
    int faceIndex = 0;
    for (int vertexIndex = 0; vertexIndex < pow(l, 3); ++vertexIndex)
    {
        cartesian4 coordinate = indexToCoordinate(vertexIndex);
        if (coordinate.z == l - 1 || coordinate.x == l - 1 || coordinate.y == l - 1)
        {
            continue;
        }
        if (coordinate.z < l - 2)
        {
            if (!(coordinate.x == 0))
            {
                // Add yz face
                addFace(vertexIndex, faceIndex, {"y", "z", "z", "y"}, {1, 1, 1, 1});
                ++faceIndex;
            }
            if (!(coordinate.y == 0))
            {
                // Add xz face
                addFace(vertexIndex, faceIndex, {"x", "z", "z", "x"}, {1, 1, 1, 1});
                ++faceIndex;
            }
        }
        // Add xy face
        addFace(vertexIndex, faceIndex, {"x", "y", "y", "x"}, {1, 1, 1, 1});
        ++faceIndex;
    }
}